

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void dumpAlign(DumpState *D,uint align)

{
  uint uVar1;
  
  uVar1 = (uint)D->offset & 3;
  if (uVar1 != 0) {
    dumpBlock(D,&dumpAlign::paddingContent,(ulong)(4 - uVar1));
    return;
  }
  return;
}

Assistant:

static void dumpAlign (DumpState *D, unsigned align) {
  unsigned padding = align - cast_uint(D->offset % align);
  if (padding < align) {  /* padding == align means no padding */
    static lua_Integer paddingContent = 0;
    lua_assert(align <= sizeof(lua_Integer));
    dumpBlock(D, &paddingContent, padding);
  }
  lua_assert(D->offset % align == 0);
}